

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBeam.h
# Opt level: O2

void __thiscall
chrono::fea::ChLoaderBeamWrenchDistributed::ChLoaderBeamWrenchDistributed
          (ChLoaderBeamWrenchDistributed *this,shared_ptr<chrono::ChLoadableU> *mloadable)

{
  double dVar1;
  __shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &mloadable->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
  ChLoaderUdistributed::ChLoaderUdistributed
            (&this->super_ChLoaderUdistributed,(shared_ptr<chrono::ChLoadableU> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_ChLoaderUdistributed).super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderU_00145de8;
  (this->torqueperunit).m_data[0] = 0.0;
  (this->torqueperunit).m_data[1] = 0.0;
  (this->torqueperunit).m_data[2] = 0.0;
  (this->forceperunit).m_data[0] = 0.0;
  (this->torqueperunit).m_data[2] = 0.0;
  (this->forceperunit).m_data[0] = 0.0;
  (this->forceperunit).m_data[1] = 0.0;
  (this->forceperunit).m_data[2] = 0.0;
  dVar1 = _string;
  if (this != (ChLoaderBeamWrenchDistributed *)chrono::ChLoadCustom::LoadGet_field_ncoords) {
    (this->torqueperunit).m_data[0] = VNULL;
    (this->torqueperunit).m_data[1] = dVar1;
    (this->torqueperunit).m_data[2] = _typeinfo;
  }
  dVar1 = _string;
  if (this != (ChLoaderBeamWrenchDistributed *)std::__throw_bad_array_new_length) {
    (this->forceperunit).m_data[0] = VNULL;
    (this->forceperunit).m_data[1] = dVar1;
    (this->forceperunit).m_data[2] = _typeinfo;
  }
  return;
}

Assistant:

ChLoaderBeamWrenchDistributed(std::shared_ptr<ChLoadableU> mloadable) : ChLoaderUdistributed(mloadable) {
        this->torqueperunit = VNULL;
        this->forceperunit = VNULL;
    }